

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoDebugger.cpp
# Opt level: O3

bool __thiscall NanoDebugger::disassembleInstruction(NanoDebugger *this,string *instruction)

{
  size_type *psVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  undefined8 *puVar5;
  long *plVar6;
  uint64_t uVar7;
  ulong *puVar8;
  char *pcVar9;
  char cVar10;
  undefined8 uVar11;
  ulong uVar12;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_2;
  Instruction ins;
  string opcode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  ulong *local_128;
  long local_120;
  ulong local_118;
  long lStack_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  Instruction local_e8;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar4 = NanoVM::fetch(&this->super_NanoVM,&local_e8);
  if (!bVar4) {
    return bVar4;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,instructionStr[local_e8.opcode],(allocator<char> *)&local_108);
  if (local_e8.opcode < 0x1e) {
    if ((0x3bb7c000U >> (local_e8.opcode & 0x1f) & 1) == 0) {
      if ((0x4400000U >> (local_e8.opcode & 0x1f) & 1) != 0) {
        std::__cxx11::string::_M_assign((string *)instruction);
        goto LAB_0010288f;
      }
      goto LAB_001028c4;
    }
    if (local_e8.srcType == '\0') {
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,local_50._M_dataplus._M_p,
                 local_50._M_dataplus._M_p + local_50._M_string_length);
      std::__cxx11::string::append((char *)&local_148);
      __len = 1;
      if (9 < local_e8.srcReg) {
        __len = 3 - (local_e8.srcReg < 100);
      }
      local_128 = &local_118;
      std::__cxx11::string::_M_construct((ulong)&local_128,(char)__len);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_128,__len,(uint)local_e8.srcReg)
      ;
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        uVar11 = local_148.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_120 + local_148._M_string_length) {
        uVar12 = 0xf;
        if (local_128 != &local_118) {
          uVar12 = local_118;
        }
        if (local_120 + local_148._M_string_length <= uVar12) {
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_128,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p);
          goto LAB_001027f1;
        }
      }
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_128);
    }
    else {
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,local_50._M_dataplus._M_p,
                 local_50._M_dataplus._M_p + local_50._M_string_length);
      std::__cxx11::string::append((char *)&local_148);
      cVar10 = '\x01';
      if (9 < local_e8.immediate) {
        uVar7 = local_e8.immediate;
        cVar3 = '\x04';
        do {
          cVar10 = cVar3;
          if (uVar7 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_00102772;
          }
          if (uVar7 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_00102772;
          }
          if (uVar7 < 10000) goto LAB_00102772;
          bVar2 = 99999 < uVar7;
          uVar7 = uVar7 / 10000;
          cVar3 = cVar10 + '\x04';
        } while (bVar2);
        cVar10 = cVar10 + '\x01';
      }
LAB_00102772:
      local_128 = &local_118;
      std::__cxx11::string::_M_construct((ulong)&local_128,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_128,(uint)local_120,local_e8.immediate);
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        uVar11 = local_148.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_120 + local_148._M_string_length) {
        uVar12 = 0xf;
        if (local_128 != &local_118) {
          uVar12 = local_118;
        }
        if (local_120 + local_148._M_string_length <= uVar12) {
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_128,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p);
          goto LAB_001027f1;
        }
      }
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_128);
    }
LAB_001027f1:
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    psVar1 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_108.field_2._M_allocated_capacity = *psVar1;
      local_108.field_2._8_8_ = puVar5[3];
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar1;
      local_108._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_108._M_string_length = puVar5[1];
    *puVar5 = psVar1;
    puVar5[1] = 0;
    *(undefined1 *)psVar1 = 0;
    std::__cxx11::string::operator=((string *)instruction,(string *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    local_90.field_2._M_allocated_capacity = local_148.field_2._M_allocated_capacity;
    local_90._M_dataplus._M_p = local_148._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p == &local_148.field_2) goto LAB_0010288f;
  }
  else {
LAB_001028c4:
    if (local_e8.srcType == '\0') {
      pcVar9 = " reg";
      if (local_e8.isDstMem != false) {
        pcVar9 = " @reg";
      }
      std::operator+(&local_90,&local_50,pcVar9);
      std::__cxx11::to_string(&local_b0,(uint)local_e8.dstReg);
      std::operator+(&local_70,&local_90,&local_b0);
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      local_128 = &local_118;
      puVar8 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar8) {
        local_118 = *puVar8;
        lStack_110 = puVar5[3];
      }
      else {
        local_118 = *puVar8;
        local_128 = (ulong *)*puVar5;
      }
      local_120 = puVar5[1];
      *puVar5 = puVar8;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      puVar8 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_148.field_2._M_allocated_capacity = *puVar8;
        local_148.field_2._8_8_ = puVar5[3];
      }
      else {
        local_148.field_2._M_allocated_capacity = *puVar8;
        local_148._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_148._M_string_length = puVar5[1];
      *puVar5 = puVar8;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      std::__cxx11::to_string(&local_d0,(uint)local_e8.srcReg);
      std::operator+(&local_108,&local_148,&local_d0);
    }
    else {
      pcVar9 = " reg";
      if (local_e8.isDstMem != false) {
        pcVar9 = " @reg";
      }
      std::operator+(&local_90,&local_50,pcVar9);
      std::__cxx11::to_string(&local_b0,(uint)local_e8.dstReg);
      std::operator+(&local_70,&local_90,&local_b0);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_128 = &local_118;
      puVar8 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar8) {
        local_118 = *puVar8;
        lStack_110 = plVar6[3];
      }
      else {
        local_118 = *puVar8;
        local_128 = (ulong *)*plVar6;
      }
      local_120 = plVar6[1];
      *plVar6 = (long)puVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_128);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      puVar8 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_148.field_2._M_allocated_capacity = *puVar8;
        local_148.field_2._8_8_ = plVar6[3];
      }
      else {
        local_148.field_2._M_allocated_capacity = *puVar8;
        local_148._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_148._M_string_length = plVar6[1];
      *plVar6 = (long)puVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::to_string(&local_d0,local_e8.immediate);
      std::operator+(&local_108,&local_148,&local_d0);
    }
    std::__cxx11::string::operator=((string *)instruction,(string *)&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_0010288f;
  }
  operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
LAB_0010288f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool NanoDebugger::disassembleInstruction(std::string &instruction) {
	Instruction ins;
	if (!fetch(ins)) {
		return false;
	}
	std::string opcode = instructionStr[ins.opcode];
	if (ins.opcode == Opcodes::Halt || ins.opcode == Opcodes::Ret) {
		instruction = opcode;
		return true;
	}
	// Single param instructions
	if (ins.opcode == Opcodes::Jg || ins.opcode == Opcodes::Js || ins.opcode == Opcodes::Jnz || ins.opcode == Opcodes::Jz ||
		ins.opcode == Opcodes::Jmp || ins.opcode == Opcodes::Push || ins.opcode == Opcodes::Pop || ins.opcode == Opcodes::Call ||
		ins.opcode == Opcodes::Dec || ins.opcode == Opcodes::Inc || ins.opcode == Opcodes::Printc || ins.opcode == Opcodes::Printi ||
		ins.opcode == Opcodes::Prints) {
		if (ins.srcType == DataType::Reg) {
			instruction = opcode + ((ins.isSrcMem) ? " @reg" : " reg") + std::to_string(ins.srcReg);
		}
		else {
			instruction = opcode + ((ins.isSrcMem) ? " @" : " ") + std::to_string(ins.immediate);
		}
	}
	// two param instruction 
	else {
		if (ins.srcType == DataType::Reg) {
			instruction = opcode + ((ins.isDstMem) ? " @reg" : " reg") + std::to_string(ins.dstReg) + ", " +
				((ins.isSrcMem) ? " @reg" : "reg") + std::to_string(ins.srcReg);
		}
		else {
			instruction = opcode + ((ins.isDstMem) ? " @reg" : " reg") + std::to_string(ins.dstReg) + ", " +
				((ins.isSrcMem) ? "@" : "") + std::to_string(ins.immediate);
		}
	}
	return true;
}